

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall QMimeBinaryProvider::ensureLoaded(QMimeBinaryProvider *this)

{
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
  *this_00;
  bool bVar1;
  CacheFile *this_01;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1String> local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_cacheFile;
  if ((this->m_cacheFile)._M_t.
      super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ._M_t.
      super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl ==
      (CacheFile *)0x0) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.a = &(this->super_QMimeProviderBase).m_directory;
    local_50.b.m_size = 0xb;
    local_50.b.m_data = "/mime.cache";
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_38,&local_50);
    this_01 = (CacheFile *)operator_new(0x28);
    CacheFile::CacheFile(this_01,&local_38);
    std::
    __uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::reset((__uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)this_00,this_01);
    this->m_mimetypeListLoaded = false;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear(&(this->m_mimetypeExtra)._M_t);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar1 = checkCacheChanged(this);
    if (!bVar1) goto LAB_004b8e52;
    this->m_mimetypeListLoaded = false;
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
    ::clear(&(this->m_mimetypeExtra)._M_t);
  }
  if (((this_00->_M_t).
       super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
       ._M_t.
       super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
       .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->m_valid ==
      false) {
    std::
    __uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::reset((__uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)this_00,(pointer)0x0);
  }
LAB_004b8e52:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeBinaryProvider::ensureLoaded()
{
    if (!m_cacheFile) {
        const QString cacheFileName = m_directory + "/mime.cache"_L1;
        m_cacheFile = std::make_unique<CacheFile>(cacheFileName);
        m_mimetypeListLoaded = false;
        m_mimetypeExtra.clear();
    } else {
        if (checkCacheChanged()) {
            m_mimetypeListLoaded = false;
            m_mimetypeExtra.clear();
        } else {
            return; // nothing to do
        }
    }
    if (!m_cacheFile->isValid()) // verify existence and version
        m_cacheFile.reset();
}